

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-env-vars.c
# Opt level: O3

int run_test_env_vars(void)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long unaff_RBX;
  long lVar4;
  undefined8 in_R9;
  long lVar5;
  char buf [10];
  int envcount;
  uv_env_item_t *envitems;
  char acStack_80 [32];
  undefined8 uStack_60;
  size_t local_58;
  char local_4e;
  undefined7 uStack_4d;
  short local_46;
  int local_44;
  long local_40;
  uv_env_item_t *local_38;
  
  uStack_60 = 0x14beb8;
  iVar1 = uv_os_setenv((char *)0x0,"foo");
  if (iVar1 == -0x16) {
    uStack_60 = 0x14becf;
    iVar1 = uv_os_setenv("UV_TEST_FOO",(char *)0x0);
    if (iVar1 != -0x16) goto LAB_0014c1cc;
    uStack_60 = 0x14bee1;
    iVar1 = uv_os_setenv((char *)0x0,(char *)0x0);
    if (iVar1 != -0x16) goto LAB_0014c1d1;
    local_58 = 10;
    uStack_60 = 0x14bf00;
    iVar1 = uv_os_getenv((char *)0x0,&local_4e,&local_58);
    if (iVar1 != -0x16) goto LAB_0014c1d6;
    uStack_60 = 0x14bf1a;
    iVar1 = uv_os_getenv("UV_TEST_FOO",(char *)0x0,&local_58);
    if (iVar1 != -0x16) goto LAB_0014c1db;
    uStack_60 = 0x14bf36;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,(size_t *)0x0);
    if (iVar1 != -0x16) goto LAB_0014c1e0;
    local_58 = 0;
    uStack_60 = 0x14bf5a;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar1 != -0x16) goto LAB_0014c1e5;
    uStack_60 = 0x14bf6a;
    iVar1 = uv_os_unsetenv((char *)0x0);
    if (iVar1 != -0x16) goto LAB_0014c1ea;
    uStack_60 = 0x14bf86;
    iVar1 = uv_os_setenv("UV_TEST_FOO","123456789");
    if (iVar1 != 0) goto LAB_0014c1ef;
    local_58 = 10;
    local_4e = '\0';
    uStack_60 = 0x14bfac;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar1 != 0) goto LAB_0014c1f4;
    if (local_46 != 0x39 || CONCAT71(uStack_4d,local_4e) != 0x3837363534333231) goto LAB_0014c1f9;
    if (local_58 != 9) goto LAB_0014c1fe;
    local_4e = '\0';
    uStack_60 = 0x14bff7;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar1 != -0x69) goto LAB_0014c203;
    if (local_58 != 10) goto LAB_0014c208;
    uStack_60 = 0x14c017;
    iVar1 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar1 != 0) goto LAB_0014c20d;
    uStack_60 = 0x14c033;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar1 != -2) goto LAB_0014c212;
    uStack_60 = 0x14c048;
    iVar1 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar1 != 0) goto LAB_0014c217;
    uStack_60 = 0x14c063;
    iVar1 = uv_os_setenv("UV_TEST_FOO","");
    if (iVar1 != 0) goto LAB_0014c21c;
    local_58 = 10;
    uStack_60 = 0x14c086;
    iVar1 = uv_os_getenv("UV_TEST_FOO",&local_4e,&local_58);
    if (iVar1 != 0) goto LAB_0014c221;
    if (local_58 != 0) goto LAB_0014c226;
    if (local_4e != '\0') goto LAB_0014c22b;
    uStack_60 = 0x14c0b7;
    iVar1 = uv_os_setenv("UV_TEST_FOO","123456789");
    if (iVar1 != 0) goto LAB_0014c230;
    uStack_60 = 0x14c0d2;
    iVar1 = uv_os_setenv("UV_TEST_FOO2","");
    if (iVar1 != 0) goto LAB_0014c235;
    uStack_60 = 0x14c0e9;
    iVar1 = uv_os_environ(&local_38,&local_44);
    if (iVar1 != 0) goto LAB_0014c23a;
    lVar4 = (long)local_44;
    unaff_RBX = lVar4;
    if (lVar4 < 1) goto LAB_0014c23f;
    unaff_RBX = lVar4 * 0x10;
    lVar5 = 0;
    iVar1 = 0;
    local_40 = lVar4;
    do {
      pcVar3 = *(char **)((long)&local_38->name + lVar5);
      uStack_60 = 0x14c129;
      iVar2 = strcmp(pcVar3,"UV_TEST_FOO");
      if (iVar2 == 0) {
        uStack_60 = 0x14c15d;
        iVar2 = strcmp(*(char **)((long)&local_38->value + lVar5),"123456789");
        if (iVar2 != 0) {
          uStack_60 = 0x14c1c2;
          run_test_env_vars_cold_27();
          goto LAB_0014c1c2;
        }
LAB_0014c161:
        iVar1 = iVar1 + 1;
      }
      else {
        uStack_60 = 0x14c13c;
        iVar2 = strcmp(pcVar3,"UV_TEST_FOO2");
        if (iVar2 == 0) {
          if (**(char **)((long)&local_38->value + lVar5) == '\0') goto LAB_0014c161;
LAB_0014c1c2:
          uStack_60 = 0x14c1c7;
          run_test_env_vars_cold_26();
          goto LAB_0014c1c7;
        }
      }
      lVar5 = lVar5 + 0x10;
    } while (unaff_RBX != lVar5);
    if (iVar1 != 2) goto LAB_0014c244;
    uStack_60 = 0x14c184;
    uv_os_free_environ(local_38,(int)local_40);
    uStack_60 = 0x14c190;
    iVar1 = uv_os_unsetenv("UV_TEST_FOO");
    if (iVar1 != 0) goto LAB_0014c249;
    uStack_60 = 0x14c1a4;
    iVar1 = uv_os_unsetenv("UV_TEST_FOO2");
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
LAB_0014c1c7:
    uStack_60 = 0x14c1cc;
    run_test_env_vars_cold_1();
LAB_0014c1cc:
    uStack_60 = 0x14c1d1;
    run_test_env_vars_cold_2();
LAB_0014c1d1:
    uStack_60 = 0x14c1d6;
    run_test_env_vars_cold_3();
LAB_0014c1d6:
    uStack_60 = 0x14c1db;
    run_test_env_vars_cold_4();
LAB_0014c1db:
    uStack_60 = 0x14c1e0;
    run_test_env_vars_cold_5();
LAB_0014c1e0:
    uStack_60 = 0x14c1e5;
    run_test_env_vars_cold_6();
LAB_0014c1e5:
    uStack_60 = 0x14c1ea;
    run_test_env_vars_cold_7();
LAB_0014c1ea:
    uStack_60 = 0x14c1ef;
    run_test_env_vars_cold_8();
LAB_0014c1ef:
    uStack_60 = 0x14c1f4;
    run_test_env_vars_cold_9();
LAB_0014c1f4:
    uStack_60 = 0x14c1f9;
    run_test_env_vars_cold_10();
LAB_0014c1f9:
    uStack_60 = 0x14c1fe;
    run_test_env_vars_cold_11();
LAB_0014c1fe:
    uStack_60 = 0x14c203;
    run_test_env_vars_cold_12();
LAB_0014c203:
    uStack_60 = 0x14c208;
    run_test_env_vars_cold_13();
LAB_0014c208:
    uStack_60 = 0x14c20d;
    run_test_env_vars_cold_14();
LAB_0014c20d:
    uStack_60 = 0x14c212;
    run_test_env_vars_cold_15();
LAB_0014c212:
    uStack_60 = 0x14c217;
    run_test_env_vars_cold_16();
LAB_0014c217:
    uStack_60 = 0x14c21c;
    run_test_env_vars_cold_17();
LAB_0014c21c:
    uStack_60 = 0x14c221;
    run_test_env_vars_cold_18();
LAB_0014c221:
    uStack_60 = 0x14c226;
    run_test_env_vars_cold_19();
LAB_0014c226:
    uStack_60 = 0x14c22b;
    run_test_env_vars_cold_20();
LAB_0014c22b:
    uStack_60 = 0x14c230;
    run_test_env_vars_cold_21();
LAB_0014c230:
    uStack_60 = 0x14c235;
    run_test_env_vars_cold_22();
LAB_0014c235:
    uStack_60 = 0x14c23a;
    run_test_env_vars_cold_23();
LAB_0014c23a:
    uStack_60 = 0x14c23f;
    run_test_env_vars_cold_24();
LAB_0014c23f:
    uStack_60 = 0x14c244;
    run_test_env_vars_cold_25();
LAB_0014c244:
    uStack_60 = 0x14c249;
    run_test_env_vars_cold_28();
LAB_0014c249:
    uStack_60 = 0x14c24e;
    run_test_env_vars_cold_29();
  }
  uStack_60 = 0x14c253;
  run_test_env_vars_cold_30();
  pcVar3 = uv_strerror(0);
  iVar1 = strcmp(pcVar3,"Success");
  if (iVar1 != 0) {
    puts("i18n error messages detected, skipping test.");
    return 0;
  }
  pcVar3 = uv_strerror(-0x16);
  pcVar3 = strstr(pcVar3,"Success");
  if (pcVar3 == (char *)0x0) {
    pcVar3 = uv_strerror(0x539);
    iVar1 = strcmp(pcVar3,"Unknown error");
    if (iVar1 != 0) goto LAB_0014c365;
    pcVar3 = uv_strerror(-0x539);
    iVar1 = strcmp(pcVar3,"Unknown error");
    if (iVar1 != 0) goto LAB_0014c36a;
    pcVar3 = uv_strerror_r(-0x16,acStack_80,0x20);
    pcVar3 = strstr(pcVar3,"Success");
    if (pcVar3 != (char *)0x0) goto LAB_0014c36f;
    pcVar3 = uv_strerror_r(0x539,acStack_80,0x20);
    pcVar3 = strstr(pcVar3,"1337");
    if (pcVar3 == (char *)0x0) goto LAB_0014c374;
    pcVar3 = uv_strerror_r(-0x539,acStack_80,0x20);
    pcVar3 = strstr(pcVar3,"-1337");
    if (pcVar3 != (char *)0x0) {
      return 0;
    }
  }
  else {
    run_test_error_message_cold_1();
LAB_0014c365:
    run_test_error_message_cold_2();
LAB_0014c36a:
    run_test_error_message_cold_3();
LAB_0014c36f:
    run_test_error_message_cold_4();
LAB_0014c374:
    run_test_error_message_cold_6();
  }
  run_test_error_message_cold_5();
  iVar1 = uv_translate_sys_error(1);
  if (iVar1 == -1) {
    iVar1 = uv_translate_sys_error(0x20);
    if (iVar1 != -0x20) goto LAB_0014c3ed;
    iVar1 = uv_translate_sys_error(0x16);
    if (iVar1 != -0x16) goto LAB_0014c3f2;
    iVar1 = uv_translate_sys_error(-0x16);
    if (iVar1 != -0x16) goto LAB_0014c3f7;
    iVar1 = uv_translate_sys_error(-0x22);
    if (iVar1 != -0x22) goto LAB_0014c3fc;
    iVar1 = uv_translate_sys_error(-0xd);
    if (iVar1 == -0xd) {
      iVar1 = uv_translate_sys_error(0);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_0014c406;
    }
  }
  else {
    run_test_sys_error_cold_1();
LAB_0014c3ed:
    run_test_sys_error_cold_2();
LAB_0014c3f2:
    run_test_sys_error_cold_3();
LAB_0014c3f7:
    run_test_sys_error_cold_4();
LAB_0014c3fc:
    run_test_sys_error_cold_5();
  }
  run_test_sys_error_cold_6();
LAB_0014c406:
  run_test_sys_error_cold_7();
  fprintf(_stderr,"Fatal error in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-fail-always.c"
          ,0x1b,"Yes, it always fails",in_R9,unaff_RBX);
  fflush(_stderr);
  abort();
}

Assistant:

TEST_IMPL(env_vars) {
  const char* name = "UV_TEST_FOO";
  const char* name2 = "UV_TEST_FOO2";
  char buf[BUF_SIZE];
  size_t size;
  int i, r, envcount, found, found_win_special;
  uv_env_item_t* envitems;

  /* Reject invalid inputs when setting an environment variable */
  r = uv_os_setenv(NULL, "foo");
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(name, NULL);
  ASSERT(r == UV_EINVAL);
  r = uv_os_setenv(NULL, NULL);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when retrieving an environment variable */
  size = BUF_SIZE;
  r = uv_os_getenv(NULL, buf, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, NULL, &size);
  ASSERT(r == UV_EINVAL);
  r = uv_os_getenv(name, buf, NULL);
  ASSERT(r == UV_EINVAL);
  size = 0;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_EINVAL);

  /* Reject invalid inputs when deleting an environment variable */
  r = uv_os_unsetenv(NULL);
  ASSERT(r == UV_EINVAL);

  /* Successfully set an environment variable */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);

  /* Successfully read an environment variable */
  size = BUF_SIZE;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(strcmp(buf, "123456789") == 0);
  ASSERT(size == BUF_SIZE - 1);

  /* Return UV_ENOBUFS if the buffer cannot hold the environment variable */
  size = BUF_SIZE - 1;
  buf[0] = '\0';
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOBUFS);
  ASSERT(size == BUF_SIZE);

  /* Successfully delete an environment variable */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Return UV_ENOENT retrieving an environment variable that does not exist */
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == UV_ENOENT);

  /* Successfully delete an environment variable that does not exist */
  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  /* Setting an environment variable to the empty string does not delete it. */
  r = uv_os_setenv(name, "");
  ASSERT(r == 0);
  size = BUF_SIZE;
  r = uv_os_getenv(name, buf, &size);
  ASSERT(r == 0);
  ASSERT(size == 0);
  ASSERT(strlen(buf) == 0);

  /* Check getting all env variables. */
  r = uv_os_setenv(name, "123456789");
  ASSERT(r == 0);
  r = uv_os_setenv(name2, "");
  ASSERT(r == 0);
#ifdef _WIN32
  /* Create a special environment variable on Windows in case there are no
     naturally occurring ones. */
  r = uv_os_setenv("=Z:", "\\");
  ASSERT(r == 0);
#endif

  r = uv_os_environ(&envitems, &envcount);
  ASSERT(r == 0);
  ASSERT(envcount > 0);

  found = 0;
  found_win_special = 0;

  for (i = 0; i < envcount; i++) {
    /* printf("Env: %s = %s\n", envitems[i].name, envitems[i].value); */
    if (strcmp(envitems[i].name, name) == 0) {
      found++;
      ASSERT(strcmp(envitems[i].value, "123456789") == 0);
    } else if (strcmp(envitems[i].name, name2) == 0) {
      found++;
      ASSERT(strlen(envitems[i].value) == 0);
    } else if (envitems[i].name[0] == '=') {
      found_win_special++;
    }
  }

  ASSERT(found == 2);
#ifdef _WIN32
  ASSERT(found_win_special > 0);
#endif

  uv_os_free_environ(envitems, envcount);

  r = uv_os_unsetenv(name);
  ASSERT(r == 0);

  r = uv_os_unsetenv(name2);
  ASSERT(r == 0);

  return 0;
}